

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O1

void test_bson_writer_shared_buffer(void)

{
  char cVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int *extraout_RDX;
  int iVar5;
  undefined8 unaff_RBP;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char *key;
  bson_t *b;
  uint8_t *buf;
  size_t buflen;
  char keystr [32];
  undefined8 uStack_118;
  char *pcStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined1 *puStack_f8;
  code *pcStack_f0;
  char *pcStack_e0;
  undefined1 auStack_d8 [8];
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 *puStack_c0;
  code *pcStack_b8;
  char *pcStack_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined8 uStack_90;
  ulong uStack_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [40];
  
  pcStack_80 = (code *)0x13676f;
  local_68 = bson_malloc0(0x20);
  local_60 = 0x20;
  uVar4 = 0;
  pcStack_80 = (code *)0x136797;
  uVar3 = bson_writer_new(&local_68,&local_60,0,bson_realloc_ctx,0);
  bVar7 = true;
  do {
    pcStack_80 = (code *)0x1367b2;
    cVar1 = bson_writer_begin(uVar3,&local_70);
    if (cVar1 == '\0') {
LAB_00136876:
      pcStack_80 = (code *)0x13687b;
      test_bson_writer_shared_buffer_cold_1();
      goto LAB_0013687b;
    }
    uVar6 = 0;
    do {
      pcStack_80 = (code *)0x1367d0;
      bson_uint32_to_string(uVar6 & 0xffffffff,&local_78,local_58,0x20);
      pcStack_80 = (code *)0x1367e6;
      cVar1 = bson_append_int64(local_70,local_78,0xffffffff,uVar6);
      if (cVar1 == '\0') {
        pcStack_80 = (code *)0x136876;
        test_bson_writer_shared_buffer_cold_2();
        goto LAB_00136876;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 1000);
    pcStack_80 = (code *)0x136802;
    uVar6 = bson_writer_get_length(uVar3);
    if (0x3000000 < uVar6) {
      pcStack_80 = (code *)0x136836;
      bson_writer_rollback(uVar3);
      break;
    }
    pcStack_80 = (code *)0x136812;
    bson_writer_end();
    bVar7 = (uint)uVar4 < 9999;
    uVar2 = (uint)uVar4 + 1;
    uVar4 = (ulong)uVar2;
  } while (uVar2 != 10000);
  pcStack_80 = (code *)0x13683e;
  uVar4 = bson_writer_get_length(uVar3);
  pcStack_80 = (code *)0x136849;
  bson_writer_destroy(uVar3);
  if (uVar4 < 0x3000000) {
    if (bVar7 != false) {
      pcStack_80 = (code *)0x136862;
      bson_free(local_68);
      return;
    }
  }
  else {
LAB_0013687b:
    pcStack_80 = (code *)0x136880;
    test_bson_writer_shared_buffer_cold_3();
  }
  pcStack_80 = test_bson_writer_empty_sequence;
  test_bson_writer_shared_buffer_cold_4();
  pcStack_a8 = (char *)0x0;
  uStack_a0 = 0;
  pcStack_b8 = (code *)0x1368b0;
  uStack_90 = uVar3;
  uStack_88 = uVar4;
  pcStack_80._0_1_ = bVar7;
  pcStack_80._1_7_ = (int7)((ulong)unaff_RBP >> 8);
  uVar3 = bson_writer_new(&pcStack_a8,&uStack_a0,0,bson_realloc_ctx,0);
  uVar4 = 5;
  do {
    pcStack_b8 = (code *)0x1368c8;
    cVar1 = bson_writer_begin(uVar3,auStack_98);
    if (cVar1 == '\0') {
      pcStack_b8 = (code *)0x136925;
      test_bson_writer_empty_sequence_cold_1();
      goto LAB_00136925;
    }
    pcStack_b8 = (code *)0x1368d4;
    bson_writer_end(uVar3);
    uVar2 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar2;
  } while (uVar2 != 0);
  auVar11[0] = -(pcStack_a8[9] == '\0');
  auVar11[1] = -(pcStack_a8[10] == '\x05');
  auVar11[2] = -(pcStack_a8[0xb] == '\0');
  auVar11[3] = -(pcStack_a8[0xc] == '\0');
  auVar11[4] = -(pcStack_a8[0xd] == '\0');
  auVar11[5] = -(pcStack_a8[0xe] == '\0');
  auVar11[6] = -(pcStack_a8[0xf] == '\x05');
  auVar11[7] = -(pcStack_a8[0x10] == '\0');
  auVar11[8] = -(pcStack_a8[0x11] == '\0');
  auVar11[9] = -(pcStack_a8[0x12] == '\0');
  auVar11[10] = -(pcStack_a8[0x13] == '\0');
  auVar11[0xb] = -(pcStack_a8[0x14] == '\x05');
  auVar11[0xc] = -(pcStack_a8[0x15] == '\0');
  auVar11[0xd] = -(pcStack_a8[0x16] == '\0');
  auVar11[0xe] = -(pcStack_a8[0x17] == '\0');
  auVar11[0xf] = -(pcStack_a8[0x18] == '\0');
  auVar8[0] = -(*pcStack_a8 == '\x05');
  auVar8[1] = -(pcStack_a8[1] == '\0');
  auVar8[2] = -(pcStack_a8[2] == '\0');
  auVar8[3] = -(pcStack_a8[3] == '\0');
  auVar8[4] = -(pcStack_a8[4] == '\0');
  auVar8[5] = -(pcStack_a8[5] == '\x05');
  auVar8[6] = -(pcStack_a8[6] == '\0');
  auVar8[7] = -(pcStack_a8[7] == '\0');
  auVar8[8] = -(pcStack_a8[8] == '\0');
  auVar8[9] = -(pcStack_a8[9] == '\0');
  auVar8[10] = -(pcStack_a8[10] == '\x05');
  auVar8[0xb] = -(pcStack_a8[0xb] == '\0');
  auVar8[0xc] = -(pcStack_a8[0xc] == '\0');
  auVar8[0xd] = -(pcStack_a8[0xd] == '\0');
  auVar8[0xe] = -(pcStack_a8[0xe] == '\0');
  auVar8[0xf] = -(pcStack_a8[0xf] == '\x05');
  auVar8 = auVar8 & auVar11;
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
    pcStack_b8 = (code *)0x13690d;
    bson_writer_destroy(uVar3);
    pcStack_b8 = (code *)0x136917;
    bson_free(pcStack_a8);
    return;
  }
LAB_00136925:
  pcStack_b8 = test_bson_writer_null_realloc;
  test_bson_writer_empty_sequence_cold_2();
  pcStack_f0 = (code *)0x13693c;
  uStack_c8 = uVar3;
  puStack_c0 = auStack_98;
  pcStack_b8 = (code *)uVar4;
  pcStack_e0 = (char *)bson_malloc0(0x20);
  uStack_d0 = 0x20;
  pcStack_f0 = (code *)0x13695c;
  uVar3 = bson_writer_new(&pcStack_e0,&uStack_d0,0,0,0);
  uVar4 = 6;
  do {
    pcStack_f0 = (code *)0x136974;
    cVar1 = bson_writer_begin(uVar3,auStack_d8);
    if (cVar1 == '\0') {
      pcStack_f0 = (code *)0x1369e2;
      test_bson_writer_null_realloc_cold_1();
      goto LAB_001369e2;
    }
    pcStack_f0 = (code *)0x136980;
    bson_writer_end(uVar3);
    uVar2 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar2;
  } while (uVar2 != 0);
  pcStack_f0 = (code *)0x136991;
  cVar1 = bson_writer_begin(uVar3,auStack_d8);
  if (cVar1 == '\0') {
    auVar12[0] = -(pcStack_e0[0x10] == '\0');
    auVar12[1] = -(pcStack_e0[0x11] == '\0');
    auVar12[2] = -(pcStack_e0[0x12] == '\0');
    auVar12[3] = -(pcStack_e0[0x13] == '\0');
    auVar12[4] = -(pcStack_e0[0x14] == '\x05');
    auVar12[5] = -(pcStack_e0[0x15] == '\0');
    auVar12[6] = -(pcStack_e0[0x16] == '\0');
    auVar12[7] = -(pcStack_e0[0x17] == '\0');
    auVar12[8] = -(pcStack_e0[0x18] == '\0');
    auVar12[9] = -(pcStack_e0[0x19] == '\x05');
    auVar12[10] = -(pcStack_e0[0x1a] == '\0');
    auVar12[0xb] = -(pcStack_e0[0x1b] == '\0');
    auVar12[0xc] = -(pcStack_e0[0x1c] == '\0');
    auVar12[0xd] = -(pcStack_e0[0x1d] == '\0');
    auVar12[0xe] = -(pcStack_e0[0x1e] == '\0');
    auVar12[0xf] = -(pcStack_e0[0x1f] == '\0');
    auVar9[0] = -(*pcStack_e0 == '\x05');
    auVar9[1] = -(pcStack_e0[1] == '\0');
    auVar9[2] = -(pcStack_e0[2] == '\0');
    auVar9[3] = -(pcStack_e0[3] == '\0');
    auVar9[4] = -(pcStack_e0[4] == '\0');
    auVar9[5] = -(pcStack_e0[5] == '\x05');
    auVar9[6] = -(pcStack_e0[6] == '\0');
    auVar9[7] = -(pcStack_e0[7] == '\0');
    auVar9[8] = -(pcStack_e0[8] == '\0');
    auVar9[9] = -(pcStack_e0[9] == '\0');
    auVar9[10] = -(pcStack_e0[10] == '\x05');
    auVar9[0xb] = -(pcStack_e0[0xb] == '\0');
    auVar9[0xc] = -(pcStack_e0[0xc] == '\0');
    auVar9[0xd] = -(pcStack_e0[0xd] == '\0');
    auVar9[0xe] = -(pcStack_e0[0xe] == '\0');
    auVar9[0xf] = -(pcStack_e0[0xf] == '\x05');
    auVar9 = auVar9 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
      pcStack_f0 = (code *)0x1369ca;
      bson_writer_destroy(uVar3);
      pcStack_f0 = (code *)0x1369d4;
      bson_free(pcStack_e0);
      return;
    }
  }
  else {
LAB_001369e2:
    pcStack_f0 = (code *)0x1369e7;
    test_bson_writer_null_realloc_cold_3();
  }
  pcStack_f0 = test_bson_writer_null_realloc_2;
  test_bson_writer_null_realloc_cold_2();
  uStack_100 = uVar3;
  puStack_f8 = auStack_d8;
  pcStack_f0 = (code *)uVar4;
  pcStack_110 = (char *)bson_malloc0(0x20);
  uStack_108 = 0x20;
  uVar3 = bson_writer_new(&pcStack_110,&uStack_108,0,0,0);
  iVar5 = 5;
  do {
    cVar1 = bson_writer_begin(uVar3,&uStack_118);
    if (cVar1 == '\0') {
      test_bson_writer_null_realloc_2_cold_1();
      goto LAB_00136acf;
    }
    bson_writer_end(uVar3);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  cVar1 = bson_writer_begin(uVar3,&uStack_118);
  if (cVar1 == '\0') {
LAB_00136acf:
    test_bson_writer_null_realloc_2_cold_2();
  }
  else {
    cVar1 = bson_append_int32(uStack_118,"a",0xffffffff,0x7b);
    if (cVar1 == '\0') {
      bson_writer_end(uVar3);
      auVar13[0] = -(pcStack_110[0x10] == '\0');
      auVar13[1] = -(pcStack_110[0x11] == '\0');
      auVar13[2] = -(pcStack_110[0x12] == '\0');
      auVar13[3] = -(pcStack_110[0x13] == '\0');
      auVar13[4] = -(pcStack_110[0x14] == '\x05');
      auVar13[5] = -(pcStack_110[0x15] == '\0');
      auVar13[6] = -(pcStack_110[0x16] == '\0');
      auVar13[7] = -(pcStack_110[0x17] == '\0');
      auVar13[8] = -(pcStack_110[0x18] == '\0');
      auVar13[9] = -(pcStack_110[0x19] == '\x05');
      auVar13[10] = -(pcStack_110[0x1a] == '\0');
      auVar13[0xb] = -(pcStack_110[0x1b] == '\0');
      auVar13[0xc] = -(pcStack_110[0x1c] == '\0');
      auVar13[0xd] = -(pcStack_110[0x1d] == '\0');
      auVar13[0xe] = -(pcStack_110[0x1e] == '\0');
      auVar13[0xf] = -(pcStack_110[0x1f] == '\0');
      auVar10[0] = -(*pcStack_110 == '\x05');
      auVar10[1] = -(pcStack_110[1] == '\0');
      auVar10[2] = -(pcStack_110[2] == '\0');
      auVar10[3] = -(pcStack_110[3] == '\0');
      auVar10[4] = -(pcStack_110[4] == '\0');
      auVar10[5] = -(pcStack_110[5] == '\x05');
      auVar10[6] = -(pcStack_110[6] == '\0');
      auVar10[7] = -(pcStack_110[7] == '\0');
      auVar10[8] = -(pcStack_110[8] == '\0');
      auVar10[9] = -(pcStack_110[9] == '\0');
      auVar10[10] = -(pcStack_110[10] == '\x05');
      auVar10[0xb] = -(pcStack_110[0xb] == '\0');
      auVar10[0xc] = -(pcStack_110[0xc] == '\0');
      auVar10[0xd] = -(pcStack_110[0xd] == '\0');
      auVar10[0xe] = -(pcStack_110[0xe] == '\0');
      auVar10[0xf] = -(pcStack_110[0xf] == '\x05');
      auVar10 = auVar10 & auVar13;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        bson_writer_destroy(uVar3);
        bson_free(pcStack_110);
        return;
      }
      goto LAB_00136ad9;
    }
  }
  test_bson_writer_null_realloc_2_cold_4();
LAB_00136ad9:
  test_bson_writer_null_realloc_2_cold_3();
  *extraout_RDX = *extraout_RDX + 1;
  bson_realloc();
  return;
}

Assistant:

static void
test_bson_writer_shared_buffer (void)
{
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   bool rolled_back = false;
   size_t buflen = 32;
   size_t n_bytes;
   bson_t *b;
   const char *key;
   char keystr[32];
   int i = 0;
   int j = 0;
   int n_docs = 10000;

   writer = bson_writer_new (&buf, &buflen, 0, bson_realloc_ctx, NULL);

   for (i = 0; i < n_docs; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));

      for (j = 0; j < 1000; j++) {
         bson_uint32_to_string (j, &key, keystr, sizeof keystr);
         BSON_ASSERT (bson_append_int64 (b, key, -1, j));
      }

      if (bson_writer_get_length (writer) > (48 * 1024 * 1024)) {
         rolled_back = true;
         bson_writer_rollback (writer);
         break;
      } else {
         bson_writer_end (writer);
      }
   }

   n_bytes = bson_writer_get_length (writer);

   bson_writer_destroy (writer);

   BSON_ASSERT_CMPINT (n_bytes, <, (48 * 1024 * 1024));
   BSON_ASSERT_CMPINT (rolled_back, ==, true);
   BSON_ASSERT (rolled_back);

   bson_free (buf);
}